

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O1

duckdb_bit duckdb_get_bit(duckdb_value val)

{
  size_t __size;
  string *psVar1;
  duckdb_bit dVar2;
  Value v;
  LogicalType local_70;
  Value local_58;
  
  duckdb::LogicalType::LogicalType(&local_70,BIT);
  duckdb::Value::DefaultCastAs(&local_58,(Value *)val,&local_70,false);
  duckdb::LogicalType::~LogicalType(&local_70);
  psVar1 = duckdb::StringValue::Get_abi_cxx11_(&local_58);
  __size = psVar1->_M_string_length;
  dVar2.data = (uint8_t *)malloc(__size);
  switchD_012e1ce8::default(dVar2.data,(psVar1->_M_dataplus)._M_p,__size);
  duckdb::Value::~Value(&local_58);
  dVar2.size = __size;
  return dVar2;
}

Assistant:

duckdb_bit duckdb_get_bit(duckdb_value val) {
	auto v = UnwrapValue(val).DefaultCastAs(duckdb::LogicalType::BIT);
	auto &str = duckdb::StringValue::Get(v);
	auto size = str.size();
	auto data = reinterpret_cast<uint8_t *>(malloc(size));
	memcpy(data, str.c_str(), size);
	return {data, size};
}